

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# striplog_unittest.cc
# Opt level: O2

int main(int param_1,char **argv)

{
  NullStream *pNVar1;
  NullStream local_170;
  
  signal(6,anon_unknown.dwarf_3331::handle_abort);
  fLB::FLAGS_logtostderr = 1;
  google::InitGoogleLogging(*argv);
  if (fLB::FLAGS_check_mode == '\x01') {
    puts("dbg");
    return 0;
  }
  google::NullStream::NullStream(&local_170);
  google::NullStream::stream(&local_170);
  google::NullStream::~NullStream(&local_170);
  google::NullStream::NullStream(&local_170);
  pNVar1 = google::NullStream::stream(&local_170);
  std::endl<char,std::char_traits<char>>((ostream *)pNVar1);
  google::NullStream::~NullStream(&local_170);
  google::NullStream::NullStream(&local_170);
  google::NullStream::stream(&local_170);
  google::NullStream::~NullStream(&local_170);
  google::NullStream::NullStream(&local_170);
  google::NullStream::stream(&local_170);
  google::NullStream::~NullStream(&local_170);
  memset(&local_170,0,0x168);
  google::NullStreamFatal::NullStreamFatal((NullStreamFatal *)&local_170);
  google::NullStream::stream(&local_170);
  google::NullStreamFatal::~NullStreamFatal((NullStreamFatal *)&local_170);
}

Assistant:

int main(int, char* argv[]) {
#if defined(_MSC_VER)
  // Avoid presenting an interactive dialog that will cause the test to time
  // out.
  _set_abort_behavior(0, _WRITE_ABORT_MSG | _CALL_REPORTFAULT);
#endif  // defined(_MSC_VER)
  std::signal(SIGABRT, handle_abort);

  FLAGS_logtostderr = true;
  InitGoogleLogging(argv[0]);
  if (FLAGS_check_mode) {
    printf("%s\n", DEBUG_MODE ? "dbg" : "opt");
    return 0;
  }
  LOG(INFO) << "TESTMESSAGE INFO";
  LOG(WARNING) << 2 << "something"
               << "TESTMESSAGE WARNING" << 1 << 'c' << A() << std::endl;
  LOG(ERROR) << "TESTMESSAGE ERROR";
  bool flag = true;
  (flag ? LOG(INFO) : LOG(ERROR)) << "TESTMESSAGE COND";
  LOG(FATAL) << "TESTMESSAGE FATAL";
}